

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveSkip::CDirectiveSkip(CDirectiveSkip *this,Expression *expression)

{
  Expression *expression_local;
  CDirectiveSkip *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveSkip_002aa138;
  Expression::Expression(&this->expression,expression);
  return;
}

Assistant:

CDirectiveSkip::CDirectiveSkip(Expression& expression)
	: expression(expression) {}